

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_279991::LaneBasedExecutionQueue::cancelAllJobs(LaneBasedExecutionQueue *this)

{
  mutex *__m;
  bool bVar1;
  LaneBasedExecutionQueue *local_50;
  code *local_48;
  undefined8 local_40;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> local_38;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard_1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  lock_guard<std::mutex> lock;
  LaneBasedExecutionQueue *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&guard,&this->readyJobsMutex);
  __m = &(this->spawnedProcesses).mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_20,__m);
  bVar1 = (this->cancelled & 1U) == 0;
  if (bVar1) {
    this->cancelled = true;
    llbuild::basic::ProcessGroup::close(&this->spawnedProcesses,(int)__m);
    std::condition_variable::notify_all();
  }
  guard_1._M_device._5_3_ = 0;
  guard_1._M_device._4_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  std::lock_guard<std::mutex>::~lock_guard(&guard);
  if (guard_1._M_device._4_4_ == 0) {
    llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,2);
    std::lock_guard<std::mutex>::lock_guard(&local_30,&this->killAfterTimeoutThreadMutex);
    local_48 = killAfterTimeout;
    local_40 = 0;
    local_50 = this;
    llvm::
    make_unique<std::thread,void((anonymous_namespace)::LaneBasedExecutionQueue::*)(),(anonymous_namespace)::LaneBasedExecutionQueue*>
              ((llvm *)&local_38,(type *)&local_48,&local_50);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
              (&this->killAfterTimeoutThread,&local_38);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&local_38);
    std::lock_guard<std::mutex>::~lock_guard(&local_30);
  }
  return;
}

Assistant:

virtual void cancelAllJobs() override {
    {
      std::lock_guard<std::mutex> lock(readyJobsMutex);
      std::lock_guard<std::mutex> guard(spawnedProcesses.mutex);
      if (cancelled) return;
      cancelled = true;
      spawnedProcesses.close();
      readyJobsCondition.notify_all();
    }

    spawnedProcesses.signalAll(SIGINT);
    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      killAfterTimeoutThread = llvm::make_unique<std::thread>(
          &LaneBasedExecutionQueue::killAfterTimeout, this);
    }
  }